

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::WriteFile(void)

{
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  string local_150 [32];
  char *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_110 [24];
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  string local_20 [32];
  
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  write_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void WriteFile() {
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // Create file
  write_data(lr_file, kStr);
  write_data(ffm_file, kStrFFM);
  write_data(csv_file, kStrCSV);
  write_data(lr_no_file, kStrNoy);
  write_data(ffm_no_file, kStrFFMNoy);
  write_data(lr_file_comma, kStr);
  write_data(ffm_file_comma, kStrFFM);
  write_data(csv_file_comma, kStrCSV);
  write_data(lr_no_file_comma, kStrNoy);
  write_data(ffm_no_file_comma, kStrFFMNoy);
}